

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O0

void mutate_sign_signed62(secp256k1_modinv64_signed62 *x)

{
  int iVar1;
  uint64_t uVar2;
  long in_RDI;
  int pos;
  int i;
  int in_stack_ffffffffffffffec;
  int local_c;
  
  for (local_c = 0; local_c < 8; local_c = local_c + 1) {
    uVar2 = testrand_bits(in_stack_ffffffffffffffec);
    iVar1 = (int)uVar2;
    if ((*(long *)(in_RDI + (long)iVar1 * 8) < 1) ||
       (0x3fffffffffffffff < *(long *)(in_RDI + (long)(iVar1 + 1) * 8))) {
      if ((*(long *)(in_RDI + (long)iVar1 * 8) < 0) &&
         (-0x4000000000000000 < *(long *)(in_RDI + (long)(iVar1 + 1) * 8))) {
        *(long *)(in_RDI + (long)iVar1 * 8) =
             *(long *)(in_RDI + (long)iVar1 * 8) + 0x4000000000000000;
        *(long *)(in_RDI + (long)(iVar1 + 1) * 8) = *(long *)(in_RDI + (long)(iVar1 + 1) * 8) + -1;
      }
    }
    else {
      *(long *)(in_RDI + (long)iVar1 * 8) =
           *(long *)(in_RDI + (long)iVar1 * 8) + -0x4000000000000000;
      *(long *)(in_RDI + (long)(iVar1 + 1) * 8) = *(long *)(in_RDI + (long)(iVar1 + 1) * 8) + 1;
    }
  }
  return;
}

Assistant:

static void mutate_sign_signed62(secp256k1_modinv64_signed62* x) {
    static const int64_t M62 = (int64_t)(UINT64_MAX >> 2);
    int i;
    for (i = 0; i < 8; ++i) {
        int pos = testrand_bits(2);
        if (x->v[pos] > 0 && x->v[pos + 1] <= M62) {
            x->v[pos] -= (M62 + 1);
            x->v[pos + 1] += 1;
        } else if (x->v[pos] < 0 && x->v[pos + 1] >= -M62) {
            x->v[pos] += (M62 + 1);
            x->v[pos + 1] -= 1;
        }
    }
}